

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_constraint_messages_tests.c
# Opt level: O0

void test_fit_piece(Constraint *constraint,char *function_name,CgreenValue actual,char *test_file,
                   int test_line,TestReporter *reporter)

{
  code *pcVar1;
  byte bVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  undefined8 in_stack_00000008;
  char *in_stack_00000010;
  
  pcVar1 = *(code **)(in_R8 + 0x38);
  bVar2 = (**(code **)(in_RDI + 0x18))(in_RDI);
  (*pcVar1)(in_R8,in_RDX,in_ECX,bVar2 & 1,
            "Piece [%f], does not fit in [%f] in function [%s] parameter [%s]",
            (int)**(char **)(in_RDI + 0x48),
            CONCAT44(in_stack_00000008._4_4_,(int)*in_stack_00000010),in_RSI,
            *(undefined8 *)(in_RDI + 0x60));
  return;
}

Assistant:

static void test_fit_piece(Constraint *constraint, const char *function_name, CgreenValue actual,
                           const char *test_file, int test_line, TestReporter *reporter) {
    (*reporter->assert_true)(
            reporter,
            test_file,
            test_line,
            (*constraint->compare)(constraint, actual),
            "Piece [%f], does not fit in [%f] in function [%s] parameter [%s]",
            ((Piece *)constraint->expected_value.value.pointer_value)->id,
            ((Struct *)actual.value.pointer_value)->id,
            function_name,
            constraint->parameter_name);
}